

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyCountItems(char *pBeg,char *pEnd)

{
  int Counter;
  
  Counter = 0;
  for (; pBeg < pEnd; pBeg = pBeg + 1) {
    Counter = Counter + (uint)(*pBeg == ':' || *pBeg == '(');
  }
  return Counter;
}

Assistant:

int Scl_LibertyCountItems( char * pBeg, char * pEnd )
{
    int Counter = 0;
    for ( ; pBeg < pEnd; pBeg++ )
        Counter += (*pBeg == '(' || *pBeg == ':');
    return Counter;
}